

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_fe241b::SatdTest_Match_Test::TestBody(SatdTest_Match_Test *this)

{
  SatdTestBase<int,_int_(*)(const_int_*,_int)> *in_RDI;
  SatdTestBase<int,_int_(*)(const_int_*,_int)> *in_stack_00000070;
  
  SatdTestBase<int,_int_(*)(const_int_*,_int)>::FillRandom(in_RDI);
  SatdTestBase<int,_int_(*)(const_int_*,_int)>::RunComparison(in_stack_00000070);
  return;
}

Assistant:

TEST_P(SatdTest, Match) {
  FillRandom();
  RunComparison();
}